

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_quaternion_slerp(void)

{
  int iVar1;
  vector3 *pvVar2;
  double angle;
  quaternion q3;
  quaternion q2;
  quaternion q1;
  quaternion q;
  
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3
            ((quaternion *)((long)&q2.field_0 + 0x18),pvVar2,1.5707963705062866);
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3
            ((quaternion *)((long)&q3.field_0 + 0x18),pvVar2,1.7278760450076192);
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3((quaternion *)&angle,pvVar2,1.8849557195089517);
  quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,0.5,
                   (quaternion *)((long)&q1.field_0 + 0x18));
  iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                            (quaternion *)((long)&q3.field_0 + 0x18));
  if (iVar1 == 0) {
    q.field_0.q[3] = (double)anon_var_dwarf_26f;
  }
  else {
    quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,0.0,
                     (quaternion *)((long)&q1.field_0 + 0x18));
    iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                              (quaternion *)((long)&q2.field_0 + 0x18));
    if (iVar1 == 0) {
      q.field_0.q[3] = (double)anon_var_dwarf_27a;
    }
    else {
      quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,1.0,
                       (quaternion *)((long)&q1.field_0 + 0x18));
      iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),(quaternion *)&angle);
      if (iVar1 == 0) {
        q.field_0.q[3] = (double)anon_var_dwarf_285;
      }
      else {
        quaternion_slerp((quaternion *)&angle,(quaternion *)((long)&q2.field_0 + 0x18),0.5,
                         (quaternion *)((long)&q1.field_0 + 0x18));
        iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                  (quaternion *)((long)&q3.field_0 + 0x18));
        if (iVar1 == 0) {
          q.field_0.q[3] = (double)anon_var_dwarf_290;
        }
        else {
          quaternion_slerp((quaternion *)&angle,(quaternion *)((long)&q2.field_0 + 0x18),0.0,
                           (quaternion *)((long)&q1.field_0 + 0x18));
          iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),(quaternion *)&angle);
          if (iVar1 == 0) {
            q.field_0.q[3] = (double)anon_var_dwarf_29b;
          }
          else {
            quaternion_slerp((quaternion *)&angle,(quaternion *)((long)&q2.field_0 + 0x18),1.0,
                             (quaternion *)((long)&q1.field_0 + 0x18));
            iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                      (quaternion *)((long)&q2.field_0 + 0x18));
            if (iVar1 == 0) {
              q.field_0.q[3] = (double)anon_var_dwarf_2a6;
            }
            else {
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3
                        ((quaternion *)((long)&q2.field_0 + 0x18),pvVar2,1.5707963705062866);
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3
                        ((quaternion *)((long)&q3.field_0 + 0x18),pvVar2,1.413716696004954);
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3((quaternion *)&angle,pvVar2,1.2566371151303812);
              quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,0.5,
                               (quaternion *)((long)&q1.field_0 + 0x18));
              iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                        (quaternion *)((long)&q3.field_0 + 0x18));
              if (iVar1 == 0) {
                q.field_0.q[3] = (double)anon_var_dwarf_2b1;
              }
              else {
                quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,0.0,
                                 (quaternion *)((long)&q1.field_0 + 0x18));
                iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                          (quaternion *)((long)&q2.field_0 + 0x18));
                if (iVar1 == 0) {
                  q.field_0.q[3] = (double)anon_var_dwarf_2bc;
                }
                else {
                  quaternion_slerp((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&angle,1.0
                                   ,(quaternion *)((long)&q1.field_0 + 0x18));
                  iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                            (quaternion *)&angle);
                  if (iVar1 == 0) {
                    q.field_0.q[3] = (double)anon_var_dwarf_2c7;
                  }
                  else {
                    quaternion_slerp((quaternion *)&angle,(quaternion *)((long)&q2.field_0 + 0x18),
                                     0.5,(quaternion *)((long)&q1.field_0 + 0x18));
                    iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                              (quaternion *)((long)&q3.field_0 + 0x18));
                    if (iVar1 == 0) {
                      q.field_0.q[3] = (double)anon_var_dwarf_2d2;
                    }
                    else {
                      quaternion_slerp((quaternion *)&angle,(quaternion *)((long)&q2.field_0 + 0x18)
                                       ,0.0,(quaternion *)((long)&q1.field_0 + 0x18));
                      iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                                (quaternion *)&angle);
                      if (iVar1 == 0) {
                        q.field_0.q[3] = (double)anon_var_dwarf_2dd;
                      }
                      else {
                        quaternion_slerp((quaternion *)&angle,
                                         (quaternion *)((long)&q2.field_0 + 0x18),1.0,
                                         (quaternion *)((long)&q1.field_0 + 0x18));
                        iVar1 = quaternion_equals((quaternion *)((long)&q1.field_0 + 0x18),
                                                  (quaternion *)((long)&q2.field_0 + 0x18));
                        if (iVar1 == 0) {
                          q.field_0.q[3] = (double)anon_var_dwarf_2e8;
                        }
                        else {
                          q.field_0.q[3] = 0.0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (char *)q.field_0.q[3];
}

Assistant:

static char *test_quaternion_slerp(void)
{
	struct quaternion q, q1, q2, q3;
	HYP_FLOAT angle;

	angle = HYP_TAU / 4.0f;

	quaternion_set_from_axis_anglev3(&q1, HYP_VECTOR3_UNIT_X, angle);
	quaternion_set_from_axis_anglev3(&q2, HYP_VECTOR3_UNIT_X, angle * 1.1f);
	quaternion_set_from_axis_anglev3(&q3, HYP_VECTOR3_UNIT_X, angle * 1.2f);

	/* half-way */
	quaternion_slerp(&q1, &q3, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* none */
	quaternion_slerp(&q1, &q3, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	/* all the way */
	quaternion_slerp(&q1, &q3, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q3));


	/* swap order half-way */
	quaternion_slerp(&q3, &q1, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* swap order none */
	quaternion_slerp(&q3, &q1, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q3));

	/* swap order all the way */
	quaternion_slerp(&q3, &q1, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q1));


	/* go reverse around the sphere */
	quaternion_set_from_axis_anglev3(&q1, HYP_VECTOR3_UNIT_X, angle);
	quaternion_set_from_axis_anglev3(&q2, HYP_VECTOR3_UNIT_X, angle * 0.9f);
	quaternion_set_from_axis_anglev3(&q3, HYP_VECTOR3_UNIT_X, angle * 0.8f);

	/* go reverse half-way */
	quaternion_slerp(&q1, &q3, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* go reverse none */
	quaternion_slerp(&q1, &q3, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	/* go reverse all the way */
	quaternion_slerp(&q1, &q3, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q3));


	/* swap order reverse half-way */
	quaternion_slerp(&q3, &q1, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* swap order reverse none */
	quaternion_slerp(&q3, &q1, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q3));

	/* swap order reverse all the way */
	quaternion_slerp(&q3, &q1, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	return NULL;
}